

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFrhs1(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *ufb,
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lfb)

{
  uint *puVar1;
  Status SVar2;
  pointer pnVar3;
  Item *pIVar4;
  undefined8 uVar5;
  int iVar6;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar7;
  cpp_dec_float<100U,_int,_void> *pcVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  cpp_dec_float<100U,_int,_void> *v;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_138;
  cpp_dec_float<100U,_int,_void> local_e8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_98;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_90;
  cpp_dec_float<100U,_int,_void> local_88;
  
  if ((this->thevectors->set).thenum < 1) {
    return;
  }
  lVar12 = 0;
  local_98 = this;
  local_90 = ufb;
LAB_0039f48d:
  SVar2 = ((this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.stat)->data[lVar12];
  if (this->theRep * SVar2 < 1) {
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 0x10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems[6] = 0;
    local_e8.data._M_elems[7] = 0;
    local_e8.data._M_elems[8] = 0;
    local_e8.data._M_elems[9] = 0;
    local_e8.data._M_elems[10] = 0;
    local_e8.data._M_elems[0xb] = 0;
    local_e8.data._M_elems[0xc] = 0;
    local_e8.data._M_elems[0xd] = 0;
    local_e8.data._M_elems._56_5_ = 0;
    local_e8.data._M_elems[0xf]._1_3_ = 0;
    local_e8.exp = 0;
    local_e8.neg = false;
    pVVar7 = ufb;
    switch(SVar2) {
    case P_FIXED:
    case P_ON_LOWER:
    case D_ON_LOWER:
    case D_ON_BOTH:
      goto switchD_0039f4fe_caseD_fffffffa;
    default:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ESVECS03 ERROR: ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"inconsistent basis must not happen!",0x23);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_138.data._M_elems._0_8_ = local_138.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"XSVECS04 This should never happen.","");
      *puVar9 = &PTR__SPxException_006a9ee8;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_138.data._M_elems._0_8_,
                 local_138.data._M_elems._0_8_ + local_138.data._M_elems._8_8_);
      *puVar9 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
    case D_ON_UPPER:
      goto switchD_0039f4fe_caseD_fffffffe;
    case P_FREE:
    case D_FREE:
    case D_UNDEFINED:
      break;
    }
  }
switchD_0039f4fe_caseD_ffffffff:
  lVar12 = lVar12 + 1;
  if ((this->thevectors->set).thenum <= lVar12) {
    return;
  }
  goto LAB_0039f48d;
switchD_0039f4fe_caseD_fffffffa:
  pVVar7 = lfb;
switchD_0039f4fe_caseD_fffffffe:
  pnVar3 = (pVVar7->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_e8.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[lVar12].m_backend.data;
  local_e8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[lVar12].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar3[lVar12].m_backend.data + 0x10);
  local_e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_e8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar3[lVar12].m_backend.data + 0x20);
  local_e8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  local_e8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar3[lVar12].m_backend.data + 0x30);
  local_e8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  uVar5 = *(undefined8 *)(puVar1 + 2);
  local_e8.data._M_elems._56_5_ = SUB85(uVar5,0);
  local_e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  local_e8.exp = pnVar3[lVar12].m_backend.exp;
  local_e8.neg = pnVar3[lVar12].m_backend.neg;
  local_e8.fpclass = pnVar3[lVar12].m_backend.fpclass;
  local_e8.prec_elem = pnVar3[lVar12].m_backend.prec_elem;
  if (local_e8.fpclass != cpp_dec_float_NaN) {
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x10;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems._56_5_ = 0;
    local_138.data._M_elems[0xf]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_138,0.0);
    iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&local_e8,&local_138);
    if (iVar6 == 0) goto switchD_0039f4fe_caseD_ffffffff;
  }
  pVVar7 = this->theFrhs;
  local_88.data._M_elems[0xf]._1_3_ = local_e8.data._M_elems[0xf]._1_3_;
  local_88.data._M_elems._56_5_ = local_e8.data._M_elems._56_5_;
  local_88.data._M_elems[0] = local_e8.data._M_elems[0];
  local_88.data._M_elems[1] = local_e8.data._M_elems[1];
  local_88.data._M_elems[2] = local_e8.data._M_elems[2];
  local_88.data._M_elems[3] = local_e8.data._M_elems[3];
  local_88.data._M_elems[0xc] = local_e8.data._M_elems[0xc];
  local_88.data._M_elems[0xd] = local_e8.data._M_elems[0xd];
  local_88.data._M_elems[8] = local_e8.data._M_elems[8];
  local_88.data._M_elems[9] = local_e8.data._M_elems[9];
  local_88.data._M_elems[10] = local_e8.data._M_elems[10];
  local_88.data._M_elems[0xb] = local_e8.data._M_elems[0xb];
  local_88.data._M_elems[4] = local_e8.data._M_elems[4];
  local_88.data._M_elems[5] = local_e8.data._M_elems[5];
  local_88.data._M_elems[6] = local_e8.data._M_elems[6];
  local_88.data._M_elems[7] = local_e8.data._M_elems[7];
  local_88.exp = local_e8.exp;
  local_88.neg = local_e8.neg;
  local_88.fpclass = local_e8.fpclass;
  local_88.prec_elem = local_e8.prec_elem;
  if (local_e8.fpclass != cpp_dec_float_finite || local_e8.data._M_elems[0] != 0) {
    local_88.neg = (bool)(local_e8.neg ^ 1);
  }
  pIVar4 = (this->thevectors->set).theitem;
  iVar6 = (this->thevectors->set).thekey[lVar12].idx;
  lVar10 = (long)pIVar4[iVar6].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
  ufb = local_90;
  this = local_98;
  if (0 < lVar10) {
    pIVar4 = pIVar4 + iVar6;
    lVar11 = lVar10 + 1;
    lVar10 = lVar10 * 0x54;
    do {
      pcVar8 = (cpp_dec_float<100U,_int,_void> *)
               ((long)&(pIVar4->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem[-1].val.m_backend.data + lVar10);
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x10;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems._56_5_ = 0;
      local_138.data._M_elems[0xf]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      v = &local_88;
      if (pcVar8 != &local_138) {
        local_138.data._M_elems[1] = local_88.data._M_elems[1];
        local_138.data._M_elems[0] = local_88.data._M_elems[0];
        local_138.data._M_elems._8_8_ =
             CONCAT44(local_88.data._M_elems[3],local_88.data._M_elems[2]);
        local_138.data._M_elems[0xc] = local_88.data._M_elems[0xc];
        local_138.data._M_elems[0xd] = local_88.data._M_elems[0xd];
        local_138.data._M_elems._56_5_ = local_88.data._M_elems._56_5_;
        local_138.data._M_elems[0xf]._1_3_ = local_88.data._M_elems[0xf]._1_3_;
        local_138.data._M_elems[8] = local_88.data._M_elems[8];
        local_138.data._M_elems[9] = local_88.data._M_elems[9];
        local_138.data._M_elems[10] = local_88.data._M_elems[10];
        local_138.data._M_elems[0xb] = local_88.data._M_elems[0xb];
        local_138.data._M_elems[4] = local_88.data._M_elems[4];
        local_138.data._M_elems[5] = local_88.data._M_elems[5];
        local_138.data._M_elems[6] = local_88.data._M_elems[6];
        local_138.data._M_elems[7] = local_88.data._M_elems[7];
        local_138.exp = local_88.exp;
        local_138.neg = local_88.neg;
        local_138.fpclass = local_88.fpclass;
        local_138.prec_elem = local_88.prec_elem;
        v = pcVar8;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_138,v);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&(pVVar7->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&(pIVar4->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem[-1].val + 1) + lVar10)].m_backend,&local_138);
      lVar11 = lVar11 + -1;
      ufb = local_90;
      this = local_98;
      lVar10 = lVar10 + -0x54;
    } while (1 < lVar11);
  }
  goto switchD_0039f4fe_caseD_ffffffff;
}

Assistant:

void SPxSolverBase<R>::computeFrhs1(
   const VectorBase<R>& ufb,    ///< upper feasibility bound for variables
   const VectorBase<R>& lfb)    ///< lower feasibility bound for variables
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(!isBasic(stat))
      {
         R x;

         // coverity[switch_selector_expr_is_constant]
         switch(stat)
         {
         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
         case SPxBasisBase<R>::Desc::P_FREE :
            continue;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            x = ufb[i];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            x = lfb[i];
            break;

         case(SPxBasisBase<R>::Desc::P_FIXED) :
            assert(EQ(lfb[i], ufb[i], this->epsilon()));

         //lint -fallthrough
         case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
            x = lfb[i];
            break;

         default:
            SPX_MSG_ERROR(std::cerr << "ESVECS03 ERROR: "
                          << "inconsistent basis must not happen!"
                          << std::endl;)
            throw SPxInternalCodeException("XSVECS04 This should never happen.");
         }

         assert(x < R(infinity));
         assert(x > R(-infinity));

         if(x != 0.0)
            theFrhs->multAdd(-x, vector(i));
      }
   }
}